

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
* __thiscall
cmGlobalGenerator::GenerateBuildCommand
          (vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
           *__return_storage_ptr__,cmGlobalGenerator *this,string *param_1,string *param_2,
          string *param_3,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *param_4,string *param_5,int param_6,bool param_7,cmBuildOptions *param_8,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *param_9)

{
  initializer_list<cmGlobalGenerator::GeneratedMakeCommand> __l;
  allocator_type local_49;
  GeneratedMakeCommand makeCommand;
  GeneratedMakeCommand local_28;
  
  makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  makeCommand.super_GeneratedMakeCommand.RequiresOutputForward = false;
  makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[56]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&makeCommand,
             (char (*) [56])"cmGlobalGenerator::GenerateBuildCommand not implemented");
  local_28.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT71(makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                         makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._0_1_);
  local_28.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_28.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT71(makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                         makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
  makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  makeCommand.super_GeneratedMakeCommand.PrimaryCommand.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_28.super_GeneratedMakeCommand.RequiresOutputForward =
       makeCommand.super_GeneratedMakeCommand.RequiresOutputForward;
  __l._M_len = 1;
  __l._M_array = &local_28;
  std::
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  ::vector(__return_storage_ptr__,__l,&local_49);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_28);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&makeCommand);
  return __return_storage_ptr__;
}

Assistant:

std::vector<cmGlobalGenerator::GeneratedMakeCommand>
cmGlobalGenerator::GenerateBuildCommand(
  const std::string& /*unused*/, const std::string& /*unused*/,
  const std::string& /*unused*/, std::vector<std::string> const& /*unused*/,
  const std::string& /*unused*/, int /*unused*/, bool /*unused*/,
  const cmBuildOptions& /*unused*/, std::vector<std::string> const& /*unused*/)
{
  GeneratedMakeCommand makeCommand;
  makeCommand.Add("cmGlobalGenerator::GenerateBuildCommand not implemented");
  return { std::move(makeCommand) };
}